

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaValPtr xmlSchemaNewQNameValue(xmlChar *namespaceName,xmlChar *localName)

{
  xmlSchemaValPtr val;
  xmlChar *localName_local;
  xmlChar *namespaceName_local;
  
  namespaceName_local = (xmlChar *)xmlSchemaNewValue(XML_SCHEMAS_QNAME);
  if ((xmlSchemaValPtr)namespaceName_local == (xmlSchemaValPtr)0x0) {
    namespaceName_local = (xmlChar *)0x0;
  }
  else {
    (((xmlSchemaValPtr)namespaceName_local)->value).qname.name = localName;
    (((xmlSchemaValPtr)namespaceName_local)->value).qname.uri = namespaceName;
  }
  return (xmlSchemaValPtr)namespaceName_local;
}

Assistant:

xmlSchemaValPtr
xmlSchemaNewQNameValue(const xmlChar *namespaceName,
		       const xmlChar *localName)
{
    xmlSchemaValPtr val;

    val = xmlSchemaNewValue(XML_SCHEMAS_QNAME);
    if (val == NULL)
	return (NULL);

    val->value.qname.name = (xmlChar *) localName;
    val->value.qname.uri = (xmlChar *) namespaceName;
    return(val);
}